

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

void Wlc_NtkTrace_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int iFrame,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues
                     ,word ValueA,Vec_Int_t *vRes)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Wlc_Obj_t *pWVar4;
  int iVar5;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar6;
  uint uVar7;
  ushort uVar8;
  
  pWVar4 = p->pObjs;
  do {
    iVar3 = (int)((long)pObj - (long)pWVar4 >> 3);
    uVar7 = iVar3 * -0x55555555;
    if (((int)uVar7 < 0) || ((p->vCopies).nSize <= (int)uVar7)) goto LAB_003607ab;
    iVar5 = (p->vCopies).pArray[uVar7 & 0x7fffffff];
    if (((long)iVar5 < 0) || (iVar2 = vMemObjs->nSize, iVar2 <= iVar5)) goto LAB_003607ab;
    if (vMemObjs->pArray[iVar5] != uVar7) {
      __assert_fail("iObj == Vec_IntEntry(vMemObjs, iNum)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                    ,0x311,
                    "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                   );
    }
    if (iFrame < 0) {
      __assert_fail("iFrame >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                    ,0x312,
                    "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                   );
    }
    uVar1 = *(ushort *)pObj;
    uVar8 = uVar1 & 0x3f;
    if (uVar8 == 1) {
LAB_0036078a:
      uVar7 = iFrame * 2 | iVar3 * 0x55555800;
LAB_00360798:
      Vec_IntPush(vRes,uVar7);
      return;
    }
    if ((iFrame == 0) && ((uVar1 & 0x3d) == 1)) {
      iVar3 = (p->vPis).nSize;
      uVar7 = (pObj->field_10).Fanins[1] - iVar3;
      if ((-1 < (int)uVar7) && ((int)uVar7 < p->vInits->nSize)) {
        iVar5 = p->vInits->pArray[uVar7];
        if ((-1 < (long)iVar5) && (iVar5 < iVar3)) {
          iVar3 = (p->vPis).pArray[iVar5];
          if ((iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_003607ca;
          uVar7 = iVar3 << 0xb;
          goto LAB_00360798;
        }
      }
LAB_003607ab:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((uVar1 & 0x3d) == 1) {
      if (uVar8 != 3) {
        __assert_fail("pObj->Type == WLC_OBJ_FO",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x156,"Wlc_Obj_t *Wlc_ObjFo2Fi(Wlc_Ntk_t *, Wlc_Obj_t *)");
      }
      uVar7 = ((pObj->field_10).Fanins[1] + (p->vPos).nSize) - (p->vPis).nSize;
      if (((int)uVar7 < 0) || ((p->vCos).nSize <= (int)uVar7)) goto LAB_003607ab;
      iVar3 = (p->vCos).pArray[uVar7];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) goto LAB_003607ca;
      pObj = pWVar4 + iVar3;
      iFrame = iFrame + -1;
    }
    else {
      if (uVar8 != 7) {
        if (uVar8 != 0x37) {
          if (uVar8 == 8) {
            Vec_WrdEntry(vValues,(iVar2 * iFrame + iVar5) * 3);
            __assert_fail("Value == 0 && Value == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                          ,0x323,
                          "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                         );
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcMem.c"
                        ,0x32e,
                        "void Wlc_NtkTrace_rec(Wlc_Ntk_t *, Wlc_Obj_t *, int, Vec_Int_t *, Vec_Wrd_t *, word, Vec_Int_t *)"
                       );
        }
        iVar5 = iVar2 * iFrame + iVar5;
        if ((iVar5 < 0) || (uVar7 = iVar5 * 3 + 1, vValues->nSize <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        if (vValues->pArray[uVar7] != ValueA) {
          pWVar4 = Wlc_ObjFanin0(p,pObj);
          Wlc_NtkTrace_rec(p,pWVar4,iFrame,vMemObjs,vValues,ValueA,vRes);
        }
        goto LAB_0036078a;
      }
      paVar6 = &pObj->field_10;
      if (((uVar1 & 0x2f) == 6) || (2 < pObj->nFanins)) {
        paVar6 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)paVar6->pFanins[0];
      }
      iVar3 = paVar6->Fanins[0];
      if (((long)iVar3 < 1) || (p->nObjsAlloc <= iVar3)) {
LAB_003607ca:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      pObj = pWVar4 + iVar3;
    }
  } while( true );
}

Assistant:

void Wlc_NtkTrace_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int iFrame, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues, word ValueA, Vec_Int_t * vRes )
{
    int iObj = Wlc_ObjId(p, pObj);
    int iNum = Wlc_ObjCopy( p, iObj );
    assert( iObj == Vec_IntEntry(vMemObjs, iNum) );
    assert( iFrame >= 0 );
    if ( Wlc_ObjIsPi(pObj) ) 
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) );
    else if ( Wlc_ObjIsCi(pObj) && iFrame == 0 ) 
    {
        int PiId = Vec_IntEntry(p->vInits, Wlc_ObjCiId(pObj)-Wlc_NtkPiNum(p) );
        int iPiObj = Wlc_ObjId( p, Wlc_NtkPi(p, PiId) );
        Vec_IntPush( vRes, (iPiObj << 11) | (iFrame << 1) );
    }
    else if ( Wlc_ObjIsCi(pObj) )
        Wlc_NtkTrace_rec( p, Wlc_ObjFo2Fi(p, pObj), iFrame - 1, vMemObjs, vValues, ValueA, vRes );
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_BUF )
        Wlc_NtkTrace_rec( p, Wlc_ObjFanin0(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_MUX )
    {
        int Index = 3*(iFrame*Vec_IntSize(vMemObjs) + iNum);
        int Value = (int)Vec_WrdEntry( vValues, Index );
        assert( Value == 0 && Value == 1 );
        Wlc_NtkTrace_rec( p, Value ? Wlc_ObjFanin2(p, pObj) : Wlc_ObjFanin1(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) | Value );
    }
    else if ( Wlc_ObjType(pObj) == WLC_OBJ_WRITE )
    {
        int Index = 3*(iFrame*Vec_IntSize(vMemObjs) + iNum);
        if ( Vec_WrdEntry(vValues, Index + 1) != ValueA ) // address 
            Wlc_NtkTrace_rec( p, Wlc_ObjFanin0(p, pObj), iFrame, vMemObjs, vValues, ValueA, vRes );
        Vec_IntPush( vRes, (iObj << 11) | (iFrame << 1) );
    }
    else assert( 0 );
}